

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::lineTest
          (TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 tangent,
          float length)

{
  tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *in_RDI;
  float fVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM6 [16];
  vec<3,_float,_(glm::qualifier)0> vVar13;
  float in_stack_00000008;
  vec3 pLine;
  vec3 pRay;
  float tLine;
  float tRay;
  vec3 nRay;
  vec3 nTan;
  vec3 nBetween;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffdc8;
  float *in_stack_fffffffffffffdd0;
  vec<3,_float,_(glm::qualifier)0> *x;
  int *in_stack_fffffffffffffdd8;
  vec<3,_float,_(glm::qualifier)0> *v2;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffde0;
  vec<3,_float,_(glm::qualifier)0> *v1;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffde8;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffdf0;
  vec<3,float,(glm::qualifier)0> local_154 [12];
  float local_148;
  undefined4 local_144;
  undefined8 local_140;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_138;
  undefined8 local_130;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_128;
  float local_124;
  undefined8 local_120;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_118;
  undefined8 local_110;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_108;
  float local_104;
  undefined8 local_100;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_f8;
  undefined8 local_f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_e8;
  vec<3,_float,_(glm::qualifier)0> local_e0;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  vec<3,float,(glm::qualifier)0> local_c4 [12];
  float local_b8;
  undefined4 local_b4;
  vec<3,_float,_(glm::qualifier)0> local_b0;
  vec<3,_float,_(glm::qualifier)0> local_9c;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  vec<3,_float,_(glm::qualifier)0> local_48;
  vec<3,_float,_(glm::qualifier)0> local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  auVar12 = in_ZMM0._8_56_;
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  local_48._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  local_68 = vmovlpd_avx(in_XMM4);
  local_88 = vmovlpd_avx(in_XMM6);
  local_78 = local_88;
  local_58 = local_68;
  local_38._0_8_ = local_48._0_8_;
  local_18 = local_28;
  vVar13 = glm::cross<float,(glm::qualifier)0>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_b0.field_2 = vVar13.field_2;
  auVar2._0_8_ = vVar13._0_8_;
  auVar2._8_56_ = auVar12;
  local_b0._0_8_ = vmovlpd_avx(auVar2._0_16_);
  local_9c._0_8_ = local_b0._0_8_;
  local_9c.field_2 = local_b0.field_2;
  fVar1 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x45b5cf);
  auVar12 = ZEXT856(0);
  if (1e-06 <= fVar1) {
    x = &local_9c;
    vVar13 = glm::cross<float,(glm::qualifier)0>
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_e0.field_2 = vVar13.field_2;
    auVar3._0_8_ = vVar13._0_8_;
    auVar3._8_56_ = auVar12;
    local_e0._0_8_ = vmovlpd_avx(auVar3._0_16_);
    v2 = &local_38;
    local_d0._0_8_ = local_e0._0_8_;
    local_d0.field_2 = local_e0.field_2;
    vVar13 = glm::cross<float,(glm::qualifier)0>
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_f8 = vVar13.field_2;
    auVar4._0_8_ = vVar13._0_8_;
    auVar4._8_56_ = auVar12;
    local_100 = vmovlpd_avx(auVar4._0_16_);
    local_f0 = local_100;
    local_e8 = local_f8;
    vVar13 = glm::operator-(in_stack_fffffffffffffde0,v2);
    local_118 = vVar13.field_2;
    auVar5._0_8_ = vVar13._0_8_;
    auVar5._8_56_ = auVar12;
    local_120 = vmovlpd_avx(auVar5._0_16_);
    v1 = &local_d0;
    local_110 = local_120;
    local_108 = local_118;
    fVar1 = glm::dot<3,float,(glm::qualifier)0>(x,in_stack_fffffffffffffdc8);
    local_104 = glm::dot<3,float,(glm::qualifier)0>(x,in_stack_fffffffffffffdc8);
    local_104 = fVar1 / local_104;
    auVar12 = ZEXT856(0);
    vVar13 = glm::operator-(v1,v2);
    local_138 = vVar13.field_2;
    auVar6._0_8_ = vVar13._0_8_;
    auVar6._8_56_ = auVar12;
    local_140 = vmovlpd_avx(auVar6._0_16_);
    local_130 = local_140;
    local_128 = local_138;
    fVar1 = glm::dot<3,float,(glm::qualifier)0>(x,in_stack_fffffffffffffdc8);
    local_124 = glm::dot<3,float,(glm::qualifier)0>(x,in_stack_fffffffffffffdc8);
    local_124 = fVar1 / local_124;
    if (((local_124 < -in_stack_00000008) || (in_stack_00000008 < local_124)) || (local_104 < 0.0))
    {
      local_144 = 0xffffffff;
      local_148 = std::numeric_limits<float>::infinity();
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_154,0.0,0.0,0.0);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<int,_float,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v1,(int *)v2,
                 (float *)x,in_stack_fffffffffffffdc8);
    }
    else {
      auVar12 = (undefined1  [56])0x0;
      vVar13 = glm::operator*(SUB84(v2,0),x);
      auVar7._0_8_ = vVar13._0_8_;
      auVar7._8_56_ = auVar12;
      vmovlpd_avx(auVar7._0_16_);
      vVar13 = glm::operator+(v1,v2);
      auVar8._0_8_ = vVar13._0_8_;
      auVar8._8_56_ = auVar12;
      vmovlpd_avx(auVar8._0_16_);
      auVar12 = (undefined1  [56])0x0;
      vVar13 = glm::operator*(SUB84(v2,0),x);
      auVar9._0_8_ = vVar13._0_8_;
      auVar9._8_56_ = auVar12;
      vmovlpd_avx(auVar9._0_16_);
      vVar13 = glm::operator+(v1,v2);
      auVar10._0_8_ = vVar13._0_8_;
      auVar10._8_56_ = auVar12;
      vmovlpd_avx(auVar10._0_16_);
      vVar13 = glm::operator-(v1,v2);
      auVar11._0_8_ = vVar13._0_8_;
      auVar11._8_56_ = auVar12;
      vmovlpd_avx(auVar11._0_16_);
      glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x45b9cc);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<float_&,_float,_glm::vec<3,_float,_(glm::qualifier)0>_&,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v1,(float *)v2,
                 (float *)x,in_stack_fffffffffffffdc8);
    }
  }
  else {
    local_b4 = 0xffffffff;
    local_b8 = std::numeric_limits<float>::infinity();
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_c4,0.0,0.0,0.0);
    std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
    tuple<int,_float,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
              ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8);
  }
  return in_RDI;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::lineTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                  glm::vec3 center, glm::vec3 tangent, float length) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 nBetween = glm::cross(rayDir, tangent);
  if (glm::length(nBetween) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  glm::vec3 nTan = glm::cross(tangent, nBetween);
  glm::vec3 nRay = glm::cross(rayDir, nBetween);

  float tRay = glm::dot(center - raySource, nTan) / glm::dot(rayDir, nTan);
  float tLine = glm::dot(raySource - center, nRay) / glm::dot(tangent, nRay);

  if (tLine < -length || tLine > length || tRay < 0)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // out of bounds or beind

  glm::vec3 pRay = raySource + tRay * rayDir;
  glm::vec3 pLine = center + tLine * tangent;

  return ret_t{tRay, glm::length(pRay - pLine), pLine};
}